

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  float fVar77;
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  float fVar78;
  float fVar79;
  undefined1 in_ZMM10 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar56 = sVar7 * uVar4;
  auVar59 = *(undefined1 (*) [16])(pcVar6 + lVar56);
  lVar55 = sVar7 * (uVar4 + 1);
  auVar3 = *(undefined1 (*) [16])(pcVar6 + lVar55);
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar8 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar54 = uVar4 * sVar7;
  lVar57 = sVar7 * (uVar4 + 1);
  fVar78 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar13 = fVar78 * *(float *)(pcVar6 + lVar56 + 0xc);
  auVar60 = vinsertps_avx(auVar59,ZEXT416((uint)fVar13),0x30);
  fVar14 = fVar78 * *(float *)(pcVar6 + lVar55 + 0xc);
  auVar58 = vinsertps_avx(auVar3,ZEXT416((uint)fVar14),0x30);
  auVar64 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + lVar54),
                          ZEXT416((uint)(fVar78 * *(float *)(pcVar8 + lVar54 + 0xc))),0x30);
  auVar67 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + lVar57),
                          ZEXT416((uint)(fVar78 * *(float *)(pcVar8 + lVar57 + 0xc))),0x30);
  fVar78 = 0.0;
  auVar70._0_4_ = auVar60._0_4_ + auVar64._0_4_ * 0.33333334;
  auVar70._4_4_ = auVar60._4_4_ + auVar64._4_4_ * 0.33333334;
  auVar70._8_4_ = auVar60._8_4_ + auVar64._8_4_ * 0.33333334;
  auVar70._12_4_ = auVar60._12_4_ + auVar64._12_4_ * 0.33333334;
  auVar60._0_4_ = auVar67._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar67._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar67._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar67._12_4_ * 0.33333334;
  auVar60 = vsubps_avx(auVar58,auVar60);
  uVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          tessellationRate;
  lVar54 = (long)(int)uVar4;
  auVar67 = ZEXT416((uint)fVar13);
  auVar64 = ZEXT416((uint)fVar14);
  if (lVar54 == 4) {
    auVar17 = vshufps_avx(auVar3,auVar3,0);
    auVar63 = vshufps_avx(auVar3,auVar3,0x55);
    auVar3 = vshufps_avx(auVar3,auVar3,0xaa);
    auVar18 = vshufps_avx(auVar64,auVar64,0);
    auVar65 = vshufps_avx(auVar60,auVar60,0);
    auVar19 = vshufps_avx(auVar60,auVar60,0x55);
    auVar20 = vshufps_avx(auVar60,auVar60,0xaa);
    auVar60 = vshufps_avx(auVar60,auVar60,0xff);
    auVar73 = vshufps_avx(auVar70,auVar70,0);
    auVar21 = vshufps_avx(auVar70,auVar70,0x55);
    auVar22 = vshufps_avx(auVar70,auVar70,0xaa);
    auVar23 = vshufps_avx(auVar59,auVar59,0);
    auVar70 = vshufps_avx(auVar70,auVar70,0xff);
    auVar24 = vshufps_avx(auVar59,auVar59,0x55);
    auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar71._0_4_ =
         auVar73._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar65._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar17._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar23._0_4_ * (float)bezier_basis0._272_4_;
    auVar71._4_4_ =
         auVar73._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar65._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar17._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar23._4_4_ * (float)bezier_basis0._276_4_;
    auVar71._8_4_ =
         auVar73._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar65._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar17._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar23._8_4_ * (float)bezier_basis0._280_4_;
    auVar71._12_4_ =
         auVar73._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar65._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar17._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar23._12_4_ * (float)bezier_basis0._284_4_;
    auVar73._0_4_ =
         auVar21._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar19._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar63._0_4_ * (float)bezier_basis0._3740_4_ +
         (float)bezier_basis0._272_4_ * auVar24._0_4_;
    auVar73._4_4_ =
         auVar21._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar19._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar63._4_4_ * (float)bezier_basis0._3744_4_ +
         (float)bezier_basis0._276_4_ * auVar24._4_4_;
    auVar73._8_4_ =
         auVar21._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar19._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar63._8_4_ * (float)bezier_basis0._3748_4_ +
         (float)bezier_basis0._280_4_ * auVar24._8_4_;
    auVar73._12_4_ =
         auVar21._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar19._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar63._12_4_ * (float)bezier_basis0._3752_4_ +
         (float)bezier_basis0._284_4_ * auVar24._12_4_;
    auVar63._0_4_ =
         (float)bezier_basis0._272_4_ * auVar59._0_4_ +
         auVar22._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar20._0_4_ * (float)bezier_basis0._2584_4_ +
         (float)bezier_basis0._3740_4_ * auVar3._0_4_;
    auVar63._4_4_ =
         (float)bezier_basis0._276_4_ * auVar59._4_4_ +
         auVar22._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar20._4_4_ * (float)bezier_basis0._2588_4_ +
         (float)bezier_basis0._3744_4_ * auVar3._4_4_;
    auVar63._8_4_ =
         (float)bezier_basis0._280_4_ * auVar59._8_4_ +
         auVar22._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar20._8_4_ * (float)bezier_basis0._2592_4_ +
         (float)bezier_basis0._3748_4_ * auVar3._8_4_;
    auVar63._12_4_ =
         (float)bezier_basis0._284_4_ * auVar59._12_4_ +
         auVar22._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar20._12_4_ * (float)bezier_basis0._2596_4_ +
         (float)bezier_basis0._3752_4_ * auVar3._12_4_;
    auVar65._0_4_ =
         (float)bezier_basis0._272_4_ * auVar67._0_4_ +
         auVar70._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar18._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar60._0_4_ * (float)bezier_basis0._2584_4_;
    auVar65._4_4_ =
         (float)bezier_basis0._276_4_ * auVar67._4_4_ +
         auVar70._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar18._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar60._4_4_ * (float)bezier_basis0._2588_4_;
    auVar65._8_4_ =
         (float)bezier_basis0._280_4_ * auVar67._8_4_ +
         auVar70._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar18._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar60._8_4_ * (float)bezier_basis0._2592_4_;
    auVar65._12_4_ =
         (float)bezier_basis0._284_4_ * auVar67._12_4_ +
         auVar70._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar18._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar60._12_4_ * (float)bezier_basis0._2596_4_;
    auVar67 = vshufps_avx(auVar71,auVar71,0xb1);
    auVar59 = vminps_avx(auVar67,auVar71);
    auVar3 = vshufpd_avx(auVar59,auVar59,1);
    auVar59 = vminps_avx(auVar3,auVar59);
    auVar70 = vshufps_avx(auVar73,auVar73,0xb1);
    auVar3 = vminps_avx(auVar70,auVar73);
    auVar60 = vshufpd_avx(auVar3,auVar3,1);
    auVar3 = vminps_avx(auVar60,auVar3);
    auVar59 = vinsertps_avx(auVar59,auVar3,0x1c);
    auVar17 = vshufps_avx(auVar63,auVar63,0xb1);
    auVar3 = vminps_avx(auVar17,auVar63);
    auVar60 = vshufpd_avx(auVar3,auVar3,1);
    auVar3 = vminps_avx(auVar60,auVar3);
    auVar59 = vinsertps_avx(auVar59,auVar3,0x20);
    auVar3 = vmaxps_avx(auVar67,auVar71);
    auVar60 = vshufpd_avx(auVar3,auVar3,1);
    auVar3 = vmaxps_avx(auVar60,auVar3);
    auVar60 = vmaxps_avx(auVar70,auVar73);
    auVar67 = vshufpd_avx(auVar60,auVar60,1);
    auVar60 = vmaxps_avx(auVar67,auVar60);
    auVar3 = vinsertps_avx(auVar3,auVar60,0x1c);
    auVar60 = vmaxps_avx(auVar17,auVar63);
    auVar67 = vshufpd_avx(auVar60,auVar60,1);
    auVar60 = vmaxps_avx(auVar67,auVar60);
    auVar3 = vinsertps_avx(auVar3,auVar60,0x20);
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar60 = vandps_avx(auVar65,auVar67);
    auVar67 = vshufps_avx(auVar60,auVar60,0xb1);
    auVar60 = vmaxps_avx(auVar67,auVar60);
    auVar67 = vshufps_avx(auVar60,auVar60,0);
    auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
    auVar60 = vmaxps_avx(auVar60,auVar67);
  }
  else {
    auVar17 = vpshufd_avx(ZEXT416(uVar4),0);
    auVar63 = vshufps_avx(auVar59,auVar59,0);
    auVar18 = vshufps_avx(auVar59,auVar59,0x55);
    auVar76 = ZEXT1664(auVar18);
    auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar67 = vshufps_avx(ZEXT416((uint)fVar13),auVar67,0);
    auVar65 = vshufps_avx(auVar70,auVar70,0);
    auVar19 = vshufps_avx(auVar70,auVar70,0x55);
    auVar20 = vshufps_avx(auVar70,auVar70,0xaa);
    auVar70 = vshufps_avx(auVar70,auVar70,0xff);
    auVar73 = vshufps_avx(auVar60,auVar60,0);
    auVar21 = vshufps_avx(auVar60,auVar60,0x55);
    auVar22 = vshufps_avx(auVar60,auVar60,0xaa);
    auVar60 = vshufps_avx(auVar60,auVar60,0xff);
    auVar23 = vshufps_avx(auVar3,auVar3,0);
    auVar24 = vshufps_avx(auVar3,auVar3,0x55);
    auVar3 = vshufps_avx(auVar3,auVar3,0xaa);
    auVar71 = vshufps_avx(ZEXT416((uint)fVar14),auVar64,0);
    lVar55 = lVar54 * 0x44;
    auVar80._8_4_ = 0x7f800000;
    auVar80._0_8_ = 0x7f8000007f800000;
    auVar80._12_4_ = 0x7f800000;
    auVar80._16_4_ = 0x7f800000;
    auVar80._20_4_ = 0x7f800000;
    auVar80._24_4_ = 0x7f800000;
    auVar80._28_4_ = 0x7f800000;
    auVar81._8_4_ = 0xff800000;
    auVar81._0_8_ = 0xff800000ff800000;
    auVar81._12_4_ = 0xff800000;
    auVar81._16_4_ = 0xff800000;
    auVar81._20_4_ = 0xff800000;
    auVar81._24_4_ = 0xff800000;
    auVar81._28_4_ = 0xff800000;
    auVar69 = ZEXT864(0) << 0x20;
    auVar12 = auVar81;
    auVar9 = auVar80;
    auVar10 = auVar80;
    auVar11 = auVar81;
    for (lVar56 = 0; auVar68 = auVar69._0_32_, lVar56 < lVar54; lVar56 = lVar56 + 8) {
      auVar16 = vpshufd_avx(ZEXT416((uint)lVar56),0);
      auVar15 = vpor_avx(auVar16,_DAT_01f4ad30);
      auVar16 = vpor_avx(auVar16,_DAT_01f7afa0);
      auVar15 = vpcmpgtd_avx(auVar17,auVar15);
      auVar15 = vpackssdw_avx(auVar15,auVar15);
      auVar16 = vpcmpgtd_avx(auVar17,auVar16);
      auVar15 = vpunpcklwd_avx(auVar15,auVar15);
      auVar66._16_16_ = auVar16;
      auVar66._0_16_ = auVar15;
      pfVar1 = (float *)(lVar55 + 0x21fbbec + lVar56 * 4);
      fVar13 = *pfVar1;
      fVar14 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar27 = pfVar1[3];
      fVar28 = pfVar1[4];
      fVar29 = pfVar1[5];
      fVar30 = pfVar1[6];
      pfVar2 = (float *)(lVar55 + 0x21fc070 + lVar56 * 4);
      fVar31 = *pfVar2;
      fVar32 = pfVar2[1];
      fVar33 = pfVar2[2];
      fVar34 = pfVar2[3];
      fVar35 = pfVar2[4];
      fVar36 = pfVar2[5];
      fVar37 = pfVar2[6];
      fVar38 = pfVar2[7];
      local_1a8 = auVar23._0_4_;
      fStack_1a4 = auVar23._4_4_;
      fStack_1a0 = auVar23._8_4_;
      fStack_19c = auVar23._12_4_;
      local_1c8 = auVar24._0_4_;
      fStack_1c4 = auVar24._4_4_;
      fStack_1c0 = auVar24._8_4_;
      fStack_1bc = auVar24._12_4_;
      local_1e8 = auVar3._0_4_;
      fStack_1e4 = auVar3._4_4_;
      fStack_1e0 = auVar3._8_4_;
      fStack_1dc = auVar3._12_4_;
      local_128 = auVar73._0_4_;
      fStack_124 = auVar73._4_4_;
      fStack_120 = auVar73._8_4_;
      fStack_11c = auVar73._12_4_;
      local_148 = auVar21._0_4_;
      fStack_144 = auVar21._4_4_;
      fStack_140 = auVar21._8_4_;
      fStack_13c = auVar21._12_4_;
      fVar77 = auVar76._28_4_ + fVar78;
      local_168 = auVar22._0_4_;
      fStack_164 = auVar22._4_4_;
      fStack_160 = auVar22._8_4_;
      fStack_15c = auVar22._12_4_;
      fVar79 = fVar78 + in_ZMM10._28_4_;
      pfVar2 = (float *)(lVar55 + 0x21fb768 + lVar56 * 4);
      fVar39 = *pfVar2;
      fVar40 = pfVar2[1];
      fVar41 = pfVar2[2];
      fVar42 = pfVar2[3];
      fVar43 = pfVar2[4];
      fVar44 = pfVar2[5];
      fVar45 = pfVar2[6];
      fVar46 = pfVar2[7];
      local_208 = auVar71._0_4_;
      fStack_204 = auVar71._4_4_;
      fStack_200 = auVar71._8_4_;
      fStack_1fc = auVar71._12_4_;
      local_188 = auVar60._0_4_;
      fStack_184 = auVar60._4_4_;
      fStack_180 = auVar60._8_4_;
      fStack_17c = auVar60._12_4_;
      local_a8 = auVar65._0_4_;
      fStack_a4 = auVar65._4_4_;
      fStack_a0 = auVar65._8_4_;
      fStack_9c = auVar65._12_4_;
      local_c8 = auVar19._0_4_;
      fStack_c4 = auVar19._4_4_;
      fStack_c0 = auVar19._8_4_;
      fStack_bc = auVar19._12_4_;
      local_e8 = auVar20._0_4_;
      fStack_e4 = auVar20._4_4_;
      fStack_e0 = auVar20._8_4_;
      fStack_dc = auVar20._12_4_;
      pfVar2 = (float *)(bezier_basis0 + lVar56 * 4 + lVar55);
      fVar47 = *pfVar2;
      fVar48 = pfVar2[1];
      fVar49 = pfVar2[2];
      fVar50 = pfVar2[3];
      fVar51 = pfVar2[4];
      fVar52 = pfVar2[5];
      fVar53 = pfVar2[6];
      fVar78 = pfVar2[7];
      local_108 = auVar70._0_4_;
      fStack_104 = auVar70._4_4_;
      fStack_100 = auVar70._8_4_;
      fStack_fc = auVar70._12_4_;
      local_28 = auVar63._0_4_;
      fStack_24 = auVar63._4_4_;
      fStack_20 = auVar63._8_4_;
      fStack_1c = auVar63._12_4_;
      auVar61._0_4_ =
           fVar47 * local_28 + fVar39 * local_a8 + fVar31 * local_1a8 + fVar13 * local_128;
      auVar61._4_4_ =
           fVar48 * fStack_24 + fVar40 * fStack_a4 + fVar32 * fStack_1a4 + fVar14 * fStack_124;
      auVar61._8_4_ =
           fVar49 * fStack_20 + fVar41 * fStack_a0 + fVar33 * fStack_1a0 + fVar26 * fStack_120;
      auVar61._12_4_ =
           fVar50 * fStack_1c + fVar42 * fStack_9c + fVar34 * fStack_19c + fVar27 * fStack_11c;
      auVar61._16_4_ =
           fVar51 * local_28 + fVar43 * local_a8 + fVar35 * local_1a8 + fVar28 * local_128;
      auVar61._20_4_ =
           fVar52 * fStack_24 + fVar44 * fStack_a4 + fVar36 * fStack_1a4 + fVar29 * fStack_124;
      auVar61._24_4_ =
           fVar53 * fStack_20 + fVar45 * fStack_a0 + fVar37 * fStack_1a0 + fVar30 * fStack_120;
      auVar61._28_4_ = fVar46 + fVar38 + auVar76._28_4_ + 0.0;
      local_48 = auVar18._0_4_;
      fStack_44 = auVar18._4_4_;
      fStack_40 = auVar18._8_4_;
      fStack_3c = auVar18._12_4_;
      auVar74._0_4_ =
           fVar47 * local_48 + fVar13 * local_148 + fVar31 * local_1c8 + fVar39 * local_c8;
      auVar74._4_4_ =
           fVar48 * fStack_44 + fVar14 * fStack_144 + fVar32 * fStack_1c4 + fVar40 * fStack_c4;
      auVar74._8_4_ =
           fVar49 * fStack_40 + fVar26 * fStack_140 + fVar33 * fStack_1c0 + fVar41 * fStack_c0;
      auVar74._12_4_ =
           fVar50 * fStack_3c + fVar27 * fStack_13c + fVar34 * fStack_1bc + fVar42 * fStack_bc;
      auVar74._16_4_ =
           fVar51 * local_48 + fVar28 * local_148 + fVar35 * local_1c8 + fVar43 * local_c8;
      auVar74._20_4_ =
           fVar52 * fStack_44 + fVar29 * fStack_144 + fVar36 * fStack_1c4 + fVar44 * fStack_c4;
      auVar74._24_4_ =
           fVar53 * fStack_40 + fVar30 * fStack_140 + fVar37 * fStack_1c0 + fVar45 * fStack_c0;
      auVar74._28_4_ = fVar46 + fVar77 + fVar38;
      auVar72 = vminps_avx(auVar9,auVar61);
      auVar9 = vblendvps_avx(auVar9,auVar72,auVar66);
      auVar72 = vminps_avx(auVar80,auVar74);
      auVar80 = vblendvps_avx(auVar80,auVar72,auVar66);
      local_68 = auVar59._0_4_;
      fStack_64 = auVar59._4_4_;
      fStack_60 = auVar59._8_4_;
      fStack_5c = auVar59._12_4_;
      auVar75._0_4_ =
           fVar47 * local_68 + fVar39 * local_e8 + fVar13 * local_168 + fVar31 * local_1e8;
      auVar75._4_4_ =
           fVar48 * fStack_64 + fVar40 * fStack_e4 + fVar14 * fStack_164 + fVar32 * fStack_1e4;
      auVar75._8_4_ =
           fVar49 * fStack_60 + fVar41 * fStack_e0 + fVar26 * fStack_160 + fVar33 * fStack_1e0;
      auVar75._12_4_ =
           fVar50 * fStack_5c + fVar42 * fStack_dc + fVar27 * fStack_15c + fVar34 * fStack_1dc;
      auVar75._16_4_ =
           fVar51 * local_68 + fVar43 * local_e8 + fVar28 * local_168 + fVar35 * local_1e8;
      auVar75._20_4_ =
           fVar52 * fStack_64 + fVar44 * fStack_e4 + fVar29 * fStack_164 + fVar36 * fStack_1e4;
      auVar75._24_4_ =
           fVar53 * fStack_60 + fVar45 * fStack_e0 + fVar30 * fStack_160 + fVar37 * fStack_1e0;
      auVar75._28_4_ = auVar72._28_4_ + fVar77 + fVar79;
      auVar76 = ZEXT3264(auVar75);
      auVar72 = vminps_avx(auVar10,auVar75);
      in_ZMM10 = ZEXT3264(auVar72);
      auVar10 = vblendvps_avx(auVar10,auVar72,auVar66);
      auVar72 = vmaxps_avx(auVar11,auVar61);
      auVar11 = vblendvps_avx(auVar11,auVar72,auVar66);
      local_88 = auVar67._0_4_;
      fStack_84 = auVar67._4_4_;
      fStack_80 = auVar67._8_4_;
      fStack_7c = auVar67._12_4_;
      auVar62._0_4_ =
           fVar47 * local_88 + fVar39 * local_108 + fVar13 * local_188 + fVar31 * local_208;
      auVar62._4_4_ =
           fVar48 * fStack_84 + fVar40 * fStack_104 + fVar14 * fStack_184 + fVar32 * fStack_204;
      auVar62._8_4_ =
           fVar49 * fStack_80 + fVar41 * fStack_100 + fVar26 * fStack_180 + fVar33 * fStack_200;
      auVar62._12_4_ =
           fVar50 * fStack_7c + fVar42 * fStack_fc + fVar27 * fStack_17c + fVar34 * fStack_1fc;
      auVar62._16_4_ =
           fVar51 * local_88 + fVar43 * local_108 + fVar28 * local_188 + fVar35 * local_208;
      auVar62._20_4_ =
           fVar52 * fStack_84 + fVar44 * fStack_104 + fVar29 * fStack_184 + fVar36 * fStack_204;
      auVar62._24_4_ =
           fVar53 * fStack_80 + fVar45 * fStack_100 + fVar30 * fStack_180 + fVar37 * fStack_200;
      auVar62._28_4_ = auVar72._28_4_ + fVar46 + pfVar1[7] + fVar38;
      auVar72 = vmaxps_avx(auVar81,auVar74);
      auVar81 = vblendvps_avx(auVar81,auVar72,auVar66);
      auVar72 = vmaxps_avx(auVar12,auVar75);
      auVar12 = vblendvps_avx(auVar12,auVar72,auVar66);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar72._16_4_ = 0x7fffffff;
      auVar72._20_4_ = 0x7fffffff;
      auVar72._24_4_ = 0x7fffffff;
      auVar72._28_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar62,auVar72);
      auVar72 = vmaxps_avx(auVar68,auVar72);
      auVar68 = vblendvps_avx(auVar68,auVar72,auVar66);
      auVar69 = ZEXT3264(auVar68);
    }
    auVar72 = vshufps_avx(auVar9,auVar9,0xb1);
    auVar9 = vminps_avx(auVar9,auVar72);
    auVar72 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar72);
    auVar59 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar9 = vminps_avx(auVar80,auVar9);
    auVar80 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar80);
    auVar3 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar3 = vunpcklps_avx(auVar59,auVar3);
    auVar9 = vshufps_avx(auVar10,auVar10,0xb1);
    auVar9 = vminps_avx(auVar10,auVar9);
    auVar80 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar80);
    auVar59 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar59 = vinsertps_avx(auVar3,auVar59,0x28);
    auVar9 = vshufps_avx(auVar11,auVar11,0xb1);
    auVar9 = vmaxps_avx(auVar11,auVar9);
    auVar80 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar80);
    auVar3 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar81,auVar81,0xb1);
    auVar9 = vmaxps_avx(auVar81,auVar9);
    auVar80 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar80);
    auVar60 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar60 = vunpcklps_avx(auVar3,auVar60);
    auVar9 = vshufps_avx(auVar12,auVar12,0xb1);
    auVar9 = vmaxps_avx(auVar12,auVar9);
    auVar80 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar80);
    auVar3 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar3 = vinsertps_avx(auVar60,auVar3,0x28);
    auVar9 = vshufps_avx(auVar68,auVar68,0xb1);
    auVar9 = vmaxps_avx(auVar68,auVar9);
    auVar80 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar80);
    auVar60 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar60 = vshufps_avx(auVar60,auVar60,0);
  }
  auVar67 = vminps_avx(auVar59,auVar58);
  auVar3 = vmaxps_avx(auVar3,auVar58);
  auVar59 = vshufps_avx(auVar64,auVar64,0);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  auVar59 = vandps_avx(auVar59,auVar64);
  auVar59 = vmaxps_avx(auVar60,auVar59);
  auVar60 = vsubps_avx(auVar67,auVar59);
  auVar58._0_4_ = auVar3._0_4_ + auVar59._0_4_;
  auVar58._4_4_ = auVar3._4_4_ + auVar59._4_4_;
  auVar58._8_4_ = auVar3._8_4_ + auVar59._8_4_;
  auVar58._12_4_ = auVar3._12_4_ + auVar59._12_4_;
  auVar59 = vandps_avx(auVar60,auVar64);
  auVar3 = vandps_avx(auVar58,auVar64);
  auVar59 = vmaxps_avx(auVar59,auVar3);
  auVar3 = vmovshdup_avx(auVar59);
  auVar3 = vmaxss_avx(auVar3,auVar59);
  auVar59 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vmaxss_avx(auVar59,auVar3);
  auVar59 = ZEXT416((uint)(auVar59._0_4_ * 4.7683716e-07));
  auVar59 = vshufps_avx(auVar59,auVar59,0);
  aVar25 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar60,auVar59);
  (__return_storage_ptr__->lower).field_0 = aVar25;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar58._0_4_ + auVar59._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar58._4_4_ + auVar59._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar58._8_4_ + auVar59._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar58._12_4_ + auVar59._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }